

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

string * __thiscall
CLOptions::AsString(string *__return_storage_ptr__,CLOptions *this,string *param_name)

{
  size_type sVar1;
  mapped_type *ppCVar2;
  ostream *poVar3;
  allocator local_19;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
          ::count(&this->params_strings,param_name);
  if (sVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] CLOptions::AsString() :: Parameter \"");
    poVar3 = std::operator<<(poVar3,(string *)param_name);
    poVar3 = std::operator<<(poVar3,"\" is not a string!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)0x0,&local_19);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_19);
  }
  else {
    ppCVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
              ::operator[](&this->params_strings,param_name);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue(__return_storage_ptr__,
             &(*ppCVar2)->
              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CLOptions::AsString(const std::string& param_name)
{
    if (params_strings.count(param_name) == 0) {
        std::cerr << "[ERROR] CLOptions::AsString() :: Parameter \"" << param_name << "\" is not a string!" << std::endl;
        return 0 ;
    } else {
        return params_strings[param_name]->getValue();
    }
}